

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_reader.h
# Opt level: O0

void cppwinrt::reader::parse_command_line<char>
               (char *cmdstart,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *argv,size_t *argument_count)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *local_58;
  char *p;
  uint local_48;
  bool first_arg;
  bool in_quotes;
  uint backslash_count;
  bool copy_character;
  string arg;
  size_t *argument_count_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argv_local;
  char *cmdstart_local;
  
  arg.field_2._8_8_ = argument_count;
  ::std::__cxx11::string::string((string *)&backslash_count);
  bVar2 = false;
  bVar1 = true;
  *(undefined8 *)arg.field_2._8_8_ = 0;
  local_58 = cmdstart;
  while( true ) {
    if (*local_58 != '\0') {
      while( true ) {
        bVar3 = true;
        if (*local_58 != ' ') {
          bVar3 = *local_58 == '\t';
        }
        if (!bVar3) break;
        local_58 = local_58 + 1;
      }
    }
    if (!bVar1) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)argv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &backslash_count);
      ::std::__cxx11::string::clear();
      *(long *)arg.field_2._8_8_ = *(long *)arg.field_2._8_8_ + 1;
    }
    if (*local_58 == '\0') break;
    while( true ) {
      bVar1 = true;
      local_48 = 0;
      for (; *local_58 == '\\'; local_58 = local_58 + 1) {
        local_48 = local_48 + 1;
      }
      if (*local_58 == '\"') {
        if ((local_48 & 1) == 0) {
          if ((bVar2) && (local_58[1] == '\"')) {
            local_58 = local_58 + 1;
          }
          else {
            bVar1 = false;
            bVar2 = (bool)(bVar2 ^ 1);
          }
        }
        local_48 = local_48 >> 1;
      }
      while (local_48 != 0) {
        ::std::__cxx11::string::push_back((char)&backslash_count);
        local_48 = local_48 - 1;
      }
      if ((*local_58 == '\0') || ((!bVar2 && ((*local_58 == ' ' || (*local_58 == '\t')))))) break;
      if (bVar1) {
        ::std::__cxx11::string::push_back((char)&backslash_count);
      }
      local_58 = local_58 + 1;
    }
    bVar1 = false;
  }
  ::std::__cxx11::string::~string((string *)&backslash_count);
  return;
}

Assistant:

static void parse_command_line(Character* cmdstart, std::vector<std::string>& argv, size_t* argument_count)
        {

            std::string arg;
            bool copy_character;
            unsigned backslash_count;
            bool in_quotes;
            bool first_arg;

            Character* p = cmdstart;
            in_quotes = false;
            first_arg = true;
            *argument_count = 0;

            while (true)
            {
                if (*p)
                {
                    while (*p == ' ' || *p == '\t')
                        ++p;
                }

                if (!first_arg)
                {
                    argv.emplace_back(arg);
                    arg.clear();
                    ++*argument_count;
                }

                if (*p == '\0')
                    break;

                while (true)
                {
                    copy_character = true;

                    // Rules:
                    // 2N     backslashes   + " ==> N backslashes and begin/end quote
                    // 2N + 1 backslashes   + " ==> N backslashes + literal "
                    // N      backslashes       ==> N backslashes
                    backslash_count = 0;

                    while (*p == '\\')
                    {
                        ++p;
                        ++backslash_count;
                    }

                    if (*p == '"')
                    {
                        // if 2N backslashes before, start/end quote, otherwise
                        // copy literally:
                        if (backslash_count % 2 == 0)
                        {
                            if (in_quotes && p[1] == '"')
                            {
                                p++; // Double quote inside quoted string
                            }
                            else
                            {
                                // Skip first quote char and copy second:
                                copy_character = false;
                                in_quotes = !in_quotes;
                            }
                        }

                        backslash_count /= 2;
                    }

                    while (backslash_count--)
                    {
                        arg.push_back('\\');
                    }

                    if (*p == '\0' || (!in_quotes && (*p == ' ' || *p == '\t')))
                        break;

                    if (copy_character)
                    {
                        arg.push_back(*p);
                    }

                    ++p;
                }

                first_arg = false;
            }
        }